

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::AdvancedSyncImageAccess::Setup(AdvancedSyncImageAccess *this)

{
  this->m_buffer = 0;
  this->m_texture = 0;
  this->m_store_program = 0;
  this->m_draw_program = 0;
  this->m_attribless_vao = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_buffer		 = 0;
		m_texture		 = 0;
		m_store_program  = 0;
		m_draw_program   = 0;
		m_attribless_vao = 0;
		return NO_ERROR;
	}